

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::is_empty(path *p,error_code *ec)

{
  bool bVar1;
  uintmax_t uVar2;
  uintmax_t sz;
  undefined1 local_48 [8];
  directory_iterator iter;
  file_status local_28;
  file_status fs;
  error_code *ec_local;
  path *p_local;
  
  fs = (file_status)ec;
  status((filesystem *)&local_28,p,ec);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)fs);
  if (bVar1) {
    p_local._7_1_ = false;
  }
  else {
    file_status::file_status
              ((file_status *)
               ((long)&iter._impl.
                       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4),&local_28);
    bVar1 = is_directory((file_status *)
                         ((long)&iter._impl.
                                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 4));
    file_status::~file_status
              ((file_status *)
               ((long)&iter._impl.
                       super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4));
    if (bVar1) {
      directory_iterator::directory_iterator((directory_iterator *)local_48,p,(error_code *)fs);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)fs);
      if (bVar1) {
        p_local._7_1_ = false;
      }
      else {
        directory_iterator::directory_iterator((directory_iterator *)&sz);
        p_local._7_1_ =
             directory_iterator::operator==
                       ((directory_iterator *)local_48,(directory_iterator *)&sz);
        directory_iterator::~directory_iterator((directory_iterator *)&sz);
      }
      directory_iterator::~directory_iterator((directory_iterator *)local_48);
    }
    else {
      uVar2 = file_size(p,(error_code *)fs);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)fs);
      if (bVar1) {
        p_local._7_1_ = false;
      }
      else {
        p_local._7_1_ = uVar2 == 0;
      }
    }
  }
  file_status::~file_status(&local_28);
  return p_local._7_1_;
}

Assistant:

GHC_INLINE bool is_empty(const path& p, std::error_code& ec) noexcept
{
    auto fs = status(p, ec);
    if (ec) {
        return false;
    }
    if (is_directory(fs)) {
        directory_iterator iter(p, ec);
        if (ec) {
            return false;
        }
        return iter == directory_iterator();
    }
    else {
        auto sz = file_size(p, ec);
        if (ec) {
            return false;
        }
        return sz == 0;
    }
}